

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void anon_unknown.dwarf_a3d2::do_encode_decode_test<long>
               (long ekey,array<const_std::byte,_8UL> ikey)

{
  size_type __idx;
  bool bVar1;
  char *pcVar2;
  reference rhs;
  int64_t in_RDI;
  AssertionResult gtest_ar_2;
  long akey;
  key_decoder dec;
  AssertionResult gtest_ar_1;
  byte byte;
  const_iterator __end0;
  const_iterator __begin0;
  array<const_std::byte,_8UL> *__range2;
  size_t i;
  AssertionResult gtest_ar;
  key_view kv;
  key_encoder enc;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  int64_t local_228;
  pointer local_220;
  size_t sStack_218;
  key_decoder local_210;
  AssertHelper local_1f8;
  Message local_1f0;
  AssertionResult local_1e8;
  value_type local_1d1;
  const_iterator local_1d0;
  const_iterator local_1c8;
  array<const_std::byte,_8UL> *local_1c0;
  size_type local_1b8;
  AssertHelper local_1b0;
  Message local_1a8;
  unsigned_long local_1a0;
  size_type local_198;
  AssertionResult local_190;
  key_view local_180 [2];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 auStack_80 [24];
  byte local_68 [8];
  undefined1 auStack_60 [24];
  int64_t local_40;
  array<const_std::byte,_8UL> local_38 [6];
  
  auStack_80._0_16_ = ZEXT816(0) << 0x40;
  auStack_60 = ZEXT824(0);
  local_e0 = ZEXT1632(auStack_80._0_16_);
  auStack_80._16_8_ = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_160 = ZEXT1632(auStack_80._0_16_);
  local_140 = local_160;
  local_120 = local_160;
  local_100 = local_160;
  local_c0 = local_e0;
  local_a0 = local_e0;
  local_40 = in_RDI;
  unodb::key_encoder::key_encoder((key_encoder *)local_160);
  unodb::key_encoder::encode((key_encoder *)local_160,local_40);
  local_180[0] = unodb::key_encoder::get_key_view((key_encoder *)local_160);
  local_198 = std::span<const_std::byte,_18446744073709551615UL>::size_bytes(local_180);
  local_1a0 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_190,"(kv.size_bytes())","(sizeof(ekey))",&local_198,&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message(&local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult(&local_190);
  local_1b8 = 0;
  local_1c0 = local_38;
  local_1c8 = std::array<const_std::byte,_8UL>::begin(local_1c0);
  local_1d0 = std::array<const_std::byte,_8UL>::end(local_1c0);
  for (; __idx = local_1b8, local_1c8 != local_1d0; local_1c8 = local_1c8 + 1) {
    local_1d1 = *local_1c8;
    local_1b8 = local_1b8 + 1;
    rhs = std::span<const_std::byte,_18446744073709551615UL>::operator[](local_180,__idx);
    testing::internal::EqHelper::Compare<std::byte,_std::byte,_nullptr>
              ((EqHelper *)&local_1e8,"(byte)","(kv[i++])",&local_1d1,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar2 = testing::AssertionResult::failure_message(&local_1e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0xa7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult(&local_1e8);
  }
  local_220 = local_180[0]._M_ptr;
  sStack_218 = local_180[0]._M_extent._M_extent_value;
  unodb::key_decoder::key_decoder(&local_210,local_180[0]);
  unodb::key_decoder::decode(&local_210,&local_228);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)&local_238,"(akey)","(ekey)",&local_228,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message(&local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult(&local_238);
  unodb::key_encoder::~key_encoder((key_encoder *)local_160);
  return;
}

Assistant:

void do_encode_decode_test(const T ekey,
                           const std::array<const std::byte, sizeof(T)> ikey) {
  unodb::key_encoder enc{};
  enc.encode(ekey);
  const unodb::key_view kv = enc.get_key_view();   // encode
  UNODB_EXPECT_EQ(kv.size_bytes(), sizeof(ekey));  // check size
  // check order.
  size_t i = 0;
  for (const auto byte : ikey) {
    UNODB_EXPECT_EQ(byte, kv[i++]);
  }
  // decode check
  unodb::key_decoder dec{kv};
  T akey;
  dec.decode(akey);
  UNODB_EXPECT_EQ(akey, ekey);
}